

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O1

int gazemu(monst *mtmp,attack *mattk)

{
  byte bVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  int tmp;
  char *line;
  uint uVar9;
  int tmp_1;
  int iVar10;
  
  bVar1 = mattk->adtyp;
  if (bVar1 < 0xc) {
    if (bVar1 != 2) {
      if (bVar1 == 0xb) {
        if ((mtmp->field_0x61 & 1) != 0) {
          return 0;
        }
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if ((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
              if (ublindf == (obj *)0x0) {
                return 0;
              }
              if (ublindf->oartifact != '\x1d') {
                return 0;
              }
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) {
              return 0;
            }
            if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
              return 0;
            }
            if ((mtmp->data->mflags3 & 0x200) == 0) {
              return 0;
            }
          }
        }
        else {
          bVar2 = worm_known(level,mtmp);
          if (bVar2 == '\0') {
            return 0;
          }
        }
        uVar3 = *(uint *)&mtmp->field_0x60;
        if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar3 & 0x280) != 0) {
            return 0;
          }
        }
        else {
          if ((uVar3 & 0x280) != 0) {
            return 0;
          }
          if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
            return 0;
          }
        }
        if ((u._1052_1_ & 0x20) != 0) {
          return 0;
        }
        bVar2 = resists_blnd(&youmonst);
        if (bVar2 != '\0') {
          return 0;
        }
        iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if (0x40 < iVar5) {
          return 0;
        }
        bVar1 = mattk->damn;
        uVar3 = (uint)bVar1;
        if (bVar1 != 0) {
          bVar8 = mattk->damd;
          uVar9 = (uint)bVar1;
          do {
            uVar4 = mt_random();
            uVar3 = uVar3 + uVar4 % (uint)bVar8;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        pcVar6 = mon_nam(mtmp);
        s_suffix(pcVar6);
        pline("You are blinded by %s radiance!");
        make_blinded((long)(int)uVar3,'\0');
        stop_occupation();
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
          uVar3 = mt_random();
          make_stunned((ulong)(uVar3 % 3 + 1),'\x01');
          return 0;
        }
        pline("Your vision quickly clears.");
        return 0;
      }
LAB_001d0583:
      warning("Gaze attack %d?");
      return 0;
    }
    if ((mtmp->field_0x61 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return 0;
          }
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return 0;
      }
    }
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if ((uVar3 >> 0x11 & 1) == 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    uVar3 = mt_random();
    if (uVar3 * -0x33333333 < 0x33333334) {
      return 0;
    }
    pcVar6 = Monnam(mtmp);
    pline("%s attacks you with a fiery gaze!",pcVar6);
    iVar5 = 2;
    iVar10 = -2;
    do {
      uVar3 = mt_random();
      iVar5 = iVar5 + uVar3 % 6;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
    fire_damageu(iVar5,mtmp,(char *)0x0,0,(uint)mtmp->m_lev,'\x01','\0');
LAB_001d11d2:
    stop_occupation();
    return 0;
  }
  if (bVar1 == 0xc) {
    if ((mtmp->field_0x61 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return 0;
          }
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return 0;
      }
    }
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if ((uVar3 >> 0x11 & 1) == 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    uVar3 = mt_random();
    if (uVar3 * -0x33333333 < 0x33333334) {
      return 0;
    }
    iVar10 = 2;
    iVar5 = -2;
    do {
      uVar3 = mt_random();
      iVar10 = iVar10 + uVar3 % 6;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    iVar5 = mtmp->mspec_used;
    uVar3 = mt_random();
    mtmp->mspec_used = uVar3 % 6 + iVar5 + iVar10;
    pcVar6 = Monnam(mtmp);
    pline("%s stares piercingly at you!",pcVar6);
    make_stunned((ulong)(iVar10 + u.uprops[0x1b].intrinsic),'\x01');
    goto LAB_001d11d2;
  }
  if (bVar1 == 0x19) {
    if ((mtmp->field_0x61 & 1) != 0) {
      return 0;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return 0;
          }
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return 0;
      }
    }
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if ((uVar3 >> 0x11 & 1) == 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (mtmp->mspec_used != 0) {
      return 0;
    }
    uVar3 = mt_random();
    if (uVar3 * -0x33333333 < 0x33333334) {
      return 0;
    }
    iVar10 = 3;
    iVar5 = -3;
    do {
      uVar3 = mt_random();
      iVar10 = iVar10 + (uVar3 & 3);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    iVar5 = mtmp->mspec_used;
    uVar3 = mt_random();
    mtmp->mspec_used = uVar3 % 6 + iVar5 + iVar10;
    if (u.uprops[0x1c].intrinsic == 0) {
      pcVar6 = Monnam(mtmp);
      s_suffix(pcVar6);
      pline("%s gaze confuses you!");
    }
    else {
      pline("You are getting more and more confused.");
    }
    make_confused((ulong)(iVar10 + u.uprops[0x1c].intrinsic),'\0');
    goto LAB_001d11d2;
  }
  if (bVar1 != 0x12) goto LAB_001d0583;
  if (((*(uint *)&mtmp->field_0x60 & 0x20100) != 0x20000) ||
     (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
      ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))))) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) {
          if (ublindf == (obj *)0x0) {
            return 0;
          }
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return 0;
      }
    }
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    pcVar7 = Monnam(mtmp);
    pcVar6 = "gazes ineffectually";
    if (mtmp->data == mons + 0x127) {
      if ((mtmp->field_0x61 & 1) == 0) {
        if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
           (pcVar6 = "doesn\'t look all that ugly", u.umonnum != u.umonster)) {
          bVar2 = dmgtype(youmonst.data,0x24);
          pcVar6 = "gazes ineffectually";
          if (bVar2 == '\0') {
            pcVar6 = "doesn\'t look all that ugly";
          }
        }
      }
      else {
        pcVar6 = "doesn\'t look all that ugly";
      }
    }
    line = "%s %s.";
    goto LAB_001d1119;
  }
  if ((((youmonst.data != mons + 0x94 && youmonst.data != mons + 0x9d) &&
        u.uprops[0x2a].extrinsic == 0) || (bVar1 = viz_array[mtmp->my][mtmp->mx], (bVar1 & 1) == 0))
     || (mtmp->data != mons + 0x127)) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          if (ublindf == (obj *)0x0) {
            return 0;
          }
          if (ublindf->oartifact != '\x1d') {
            return 0;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return 0;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return 0;
        }
        if ((mtmp->data->mflags3 & 0x200) == 0) {
          return 0;
        }
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') {
        return 0;
      }
    }
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
    }
    else {
      if ((uVar3 & 0x280) != 0) {
        return 0;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return 0;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return 0;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return 0;
    }
    if (u.uprops[8].extrinsic != 0) {
      return 0;
    }
    if (((byte)youmonst.mintrinsics & 0x80) != 0) {
      return 0;
    }
    pcVar6 = mon_nam(mtmp);
    pcVar6 = s_suffix(pcVar6);
    pline("You meet %s gaze.",pcVar6);
    stop_occupation();
    bVar2 = poly_when_stoned(youmonst.data);
    if ((bVar2 != '\0') && (iVar5 = polymon(0x108), iVar5 != 0)) {
      return 0;
    }
    if (u.uprops[0x21].intrinsic == 0) {
      pline("You begin to turn into stone!");
    }
    pcVar6 = mons_mname(mtmp->data);
    delayed_petrify((char *)0x0,pcVar6);
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if (((bVar1 & 2) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((bVar8 = 1, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (bVar8 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)))) && (bVar8 = 1, (bVar1 & 1) != 0)))
       ) goto LAB_001d122d;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') {
      bVar8 = 1;
    }
    else {
LAB_001d122d:
      uVar3 = *(uint *)&mtmp->field_0x60;
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        bVar8 = 1;
        if (-1 < (char)uVar3) goto LAB_001d1266;
      }
      else {
        bVar8 = 1;
        if ((-1 < (char)uVar3) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001d1266:
          bVar8 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar3 >> 9) & 1;
        }
      }
    }
  }
  if (bVar8 == 0) {
    pcVar6 = Monnam(mtmp);
    pcVar6 = s_suffix(pcVar6);
    ureflects("%s gaze is reflected by your %s.",pcVar6);
    pcVar6 = "The gaze is reflected away by %s %s!";
  }
  else {
    pcVar6 = (char *)0x0;
  }
  bVar2 = mon_reflects(mtmp,pcVar6);
  if (bVar2 != '\0') {
    return 0;
  }
  if ((((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
          (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
        (u.uprops[0xd].blocked != 0)) || ((mtmp->data->mflags1 & 0x1000000) != 0)) &&
      (((u._1052_1_ & 0x22) == 0 && ((mtmp->field_0x61 & 2) == 0)))) &&
     ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) {
    if (bVar8 == 0) {
      pcVar6 = Monnam(mtmp);
      pline("%s is turned to stone!",pcVar6);
    }
    stoned = '\x01';
    killed(mtmp);
    if (0 < mtmp->mhp) {
      return 0;
    }
    return 2;
  }
  if (bVar8 != 0) {
    return 0;
  }
  pcVar7 = Monnam(mtmp);
  iVar5 = pronoun_gender(level,mtmp);
  pcVar6 = genders[iVar5].his;
  line = "%s doesn\'t seem to notice that %s gaze was reflected.";
LAB_001d1119:
  pline(line,pcVar7,pcVar6);
  return 0;
}

Assistant:

int gazemu(struct monst *mtmp, const struct attack *mattk)
{
	switch(mattk->adtyp) {
	    case AD_STON:
		if (mtmp->mcan || !mtmp->mcansee || Hallucination) {
		    if (!canseemon(level, mtmp)) break;	/* silently */
		    pline("%s %s.", Monnam(mtmp),
			  (mtmp->data == &mons[PM_MEDUSA] &&
			   (mtmp->mcan || Hallucination)) ?
				"doesn't look all that ugly" :
				"gazes ineffectually");
		    break;
		}
		if (Reflecting && couldsee(mtmp->mx, mtmp->my) &&
			mtmp->data == &mons[PM_MEDUSA]) {
		    /* hero has line of sight to Medusa and she's not blind */
		    boolean useeit = canseemon(level, mtmp);

		    if (useeit)
			ureflects("%s gaze is reflected by your %s.",
					 s_suffix(Monnam(mtmp)));
		    if (mon_reflects(mtmp, !useeit ? NULL :
				     "The gaze is reflected away by %s %s!"))
			break;
		    if (!m_canseeu(mtmp)) { /* probably you're invisible */
			if (useeit)
			    pline(
		      "%s doesn't seem to notice that %s gaze was reflected.",
				  Monnam(mtmp), mhis(level, mtmp));
			break;
		    }
		    if (useeit)
			pline("%s is turned to stone!", Monnam(mtmp));
		    stoned = TRUE;
		    killed(mtmp);

		    if (mtmp->mhp > 0) break;
		    return 2;
		}
		if (canseemon(level, mtmp) && couldsee(mtmp->mx, mtmp->my) &&
		    !Stone_resistance) {
		    pline("You meet %s gaze.", s_suffix(mon_nam(mtmp)));
		    stop_occupation();
		    if (poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))
			break;
		    if (!Stoned) pline("You begin to turn into stone!");
		    delayed_petrify(NULL, mons_mname(mtmp->data));
		}
		break;
	    case AD_CONF:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) &&
		   mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    int conf = dice(3,4);

		    mtmp->mspec_used = mtmp->mspec_used + (conf + rn2(6));
		    if (!Confusion)
			pline("%s gaze confuses you!",
			                  s_suffix(Monnam(mtmp)));
		    else
			pline("You are getting more and more confused.");
		    make_confused(HConfusion + conf, FALSE);
		    stop_occupation();
		}
		break;
	    case AD_STUN:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) &&
		   mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    int stun = dice(2,6);

		    mtmp->mspec_used = mtmp->mspec_used + (stun + rn2(6));
		    pline("%s stares piercingly at you!", Monnam(mtmp));
		    make_stunned(HStun + stun, TRUE);
		    stop_occupation();
		}
		break;
	    case AD_BLND:
		if (!mtmp->mcan && canseemon(level, mtmp) && !resists_blnd(&youmonst)
			&& distu(mtmp->mx,mtmp->my) <= BOLT_LIM*BOLT_LIM) {
		    int blnd = dice((int)mattk->damn, (int)mattk->damd);

		    pline("You are blinded by %s radiance!",
			              s_suffix(mon_nam(mtmp)));
		    make_blinded((long)blnd,FALSE);
		    stop_occupation();
		    /* not blind at this point implies you're wearing
		       the Eyes of the Overworld; make them block this
		       particular stun attack too */
		    if (!Blind) pline("Your vision quickly clears.");
		    else make_stunned((long)dice(1,3),TRUE);
		}
		break;
	    case AD_FIRE:
		if (!mtmp->mcan && canseemon(level, mtmp) &&
			couldsee(mtmp->mx, mtmp->my) &&
			mtmp->mcansee && !mtmp->mspec_used && rn2(5)) {
		    pline("%s attacks you with a fiery gaze!", Monnam(mtmp));
		    fire_damageu(dice(2, 6), mtmp, NULL, 0,
				 mtmp->m_lev, TRUE, FALSE);
		    stop_occupation();
		}
		break;
#ifdef PM_BEHOLDER /* work in progress */
	    case AD_SLEE:
		if (!mtmp->mcan && canseemon(mtmp) &&
		   couldsee(mtmp->mx, mtmp->my) && mtmp->mcansee &&
		   multi >= 0 && !rn2(5) && !FSleep_resistance) {

		    fall_asleep(-rnd(PSleep_resistance ? 5 : 10), TRUE);
		    pline("%s gaze makes you very sleepy...",
			  s_suffix(Monnam(mtmp)));
		}
		break;
	    case AD_SLOW:
		if (!mtmp->mcan && canseemon(mtmp) && mtmp->mcansee &&
		   (HFast & (INTRINSIC|TIMEOUT)) &&
		   !defends(AD_SLOW, uwep) && !rn2(4))

		    u_slow_down();
		    stop_occupation();
		break;
#endif
	    default: warning("Gaze attack %d?", mattk->adtyp);
		break;
	}
	return 0;
}